

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::MultiNode<int,_int>_>::erase
          (Span<QHashPrivate::MultiNode<int,_int>_> *this,size_t bucket)

{
  byte bVar1;
  void *pvVar2;
  Entry *pEVar3;
  void *pvVar4;
  
  bVar1 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar3 = this->entries;
  pvVar4 = *(void **)(pEVar3[bVar1].storage.data + 8);
  if (pvVar4 != (void *)0x0) {
    do {
      pvVar2 = *(void **)((long)pvVar4 + 8);
      operator_delete(pvVar4,0x10);
      pvVar4 = pvVar2;
    } while (pvVar2 != (void *)0x0);
    pEVar3 = this->entries;
  }
  pEVar3[bVar1].storage.data[0] = this->nextFree;
  this->nextFree = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }